

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

pair<int,_int> embree::quad_index2(int p,int a0,int a1,int b0,int b1)

{
  ulong uVar1;
  pair<int,_int> pVar2;
  
  if (b0 == a0) {
    uVar1 = (ulong)(p - 1);
  }
  else {
    if (b0 != a1) {
      if (b1 == a0) {
        uVar1 = (ulong)(p - 1);
      }
      else {
        if (b1 != a1) {
          pVar2.first = 0;
          pVar2.second = -1;
          return pVar2;
        }
        uVar1 = (ulong)(uint)p;
      }
      return (pair<int,_int>)(uVar1 | (ulong)(uint)b0 << 0x20);
    }
    uVar1 = (ulong)(uint)p;
  }
  return (pair<int,_int>)(uVar1 | (ulong)(uint)b1 << 0x20);
}

Assistant:

std::pair<int,int> quad_index2(int p, int a0, int a1, int b0, int b1)
  {
    if      (b0 == a0) return std::make_pair(p-1,b1);
    else if (b0 == a1) return std::make_pair(p+0,b1);
    else if (b1 == a0) return std::make_pair(p-1,b0);
    else if (b1 == a1) return std::make_pair(p+0,b0);
    else return std::make_pair(0,-1);
  }